

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::BasicReporter::Result(BasicReporter *this,AssertionResult *assertionResult)

{
  undefined1 uVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  OfType OVar5;
  IConfig *pIVar6;
  ulong uVar7;
  AssertionResult *this_00;
  ostream *poVar8;
  AssertionResult *in_RSI;
  string *in_RDI;
  Colour colour_10;
  Colour colour_9;
  Colour okAnywayColour_1;
  Colour colour_8;
  Colour colour_7;
  Colour colour_6;
  Colour colour_5;
  Colour colour_4;
  Colour colour_3;
  Colour colour_2;
  Colour okAnywayColour;
  Colour errorColour;
  Colour successColour;
  Colour colour_1;
  Colour colour;
  AssertionResult *in_stack_fffffffffffffd08;
  Code CVar9;
  AssertionResult *in_stack_fffffffffffffd10;
  AssertionResult *in_stack_fffffffffffffd18;
  AssertionResult *in_stack_fffffffffffffd68;
  undefined5 in_stack_fffffffffffffd90;
  byte bVar10;
  undefined1 uVar11;
  BasicReporter *this_01;
  string local_250 [16];
  BasicReporter *in_stack_fffffffffffffdc0;
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [40];
  string local_198 [40];
  string local_170 [39];
  allocator local_149;
  string local_148 [40];
  string local_120 [39];
  allocator local_f9;
  string local_f8 [40];
  string local_d0 [40];
  string local_a8 [144];
  undefined1 local_18 [24];
  
  this_01 = (BasicReporter *)local_18;
  local_18._8_8_ = in_RSI;
  ReporterConfig::fullConfig((ReporterConfig *)in_stack_fffffffffffffd08);
  pIVar6 = Ptr<Catch::IConfig>::operator->((Ptr<Catch::IConfig> *)this_01);
  uVar4 = (*(pIVar6->super_IShared).super_NonCopyable._vptr_NonCopyable[7])();
  bVar10 = false;
  if ((uVar4 & 1) == 0) {
    OVar5 = AssertionResult::getResultType((AssertionResult *)local_18._8_8_);
    bVar10 = OVar5 == Ok;
  }
  uVar11 = bVar10;
  Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)in_stack_fffffffffffffd10);
  if ((bVar10 & 1) != 0) {
    return;
  }
  startSpansLazily(in_stack_fffffffffffffdc0);
  AssertionResult::getSourceInfo(in_stack_fffffffffffffd08);
  uVar1 = SourceLineInfo::empty((SourceLineInfo *)0x1825ed);
  bVar2 = uVar1 ^ 0xff;
  SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x182610);
  if ((bVar2 & 1) != 0) {
    Colour::Colour((Colour *)in_stack_fffffffffffffd10,
                   (Code)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
    AssertionResult::getSourceInfo(in_stack_fffffffffffffd08);
    poVar8 = operator<<((ostream *)in_stack_fffffffffffffd10,
                        (SourceLineInfo *)in_stack_fffffffffffffd08);
    std::operator<<(poVar8,": ");
    SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x182695);
    Colour::~Colour((Colour *)0x1826a2);
  }
  bVar3 = AssertionResult::hasExpression((AssertionResult *)0x182720);
  if (bVar3) {
    Colour::Colour((Colour *)in_stack_fffffffffffffd10,
                   (Code)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    in_stack_fffffffffffffd68 =
         (AssertionResult *)ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
    AssertionResult::getExpression_abi_cxx11_(in_stack_fffffffffffffd18);
    std::operator<<((ostream *)in_stack_fffffffffffffd68,local_a8);
    std::__cxx11::string::~string(local_a8);
    bVar3 = AssertionResult::succeeded((AssertionResult *)0x182796);
    CVar9 = (Code)((ulong)in_stack_fffffffffffffd08 >> 0x20);
    if (bVar3) {
      Colour::Colour((Colour *)in_stack_fffffffffffffd10,CVar9);
      poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
      std::operator<<(poVar8," succeeded");
      Colour::~Colour((Colour *)0x1827ec);
    }
    else {
      Colour::Colour((Colour *)in_stack_fffffffffffffd10,CVar9);
      poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
      std::operator<<(poVar8," failed");
      bVar3 = AssertionResult::isOk(in_stack_fffffffffffffd10);
      if (bVar3) {
        Colour::Colour((Colour *)in_stack_fffffffffffffd10,
                       (Code)((ulong)in_stack_fffffffffffffd08 >> 0x20));
        poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
        std::operator<<(poVar8," - but was ok");
        Colour::~Colour((Colour *)0x1828ec);
      }
      Colour::~Colour((Colour *)0x182934);
    }
    Colour::~Colour((Colour *)0x182952);
  }
  OVar5 = AssertionResult::getResultType((AssertionResult *)local_18._8_8_);
  if (1 < (uint)(OVar5 + Info)) {
    CVar9 = (Code)((ulong)in_stack_fffffffffffffd08 >> 0x20);
    if (OVar5 == Info) {
      Colour::Colour((Colour *)in_stack_fffffffffffffd10,CVar9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"info",&local_f9);
      AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffd08);
      streamVariableLengthText
                (this_01,in_RDI,
                 (string *)
                 CONCAT17(uVar11,CONCAT16(bVar10,CONCAT15(uVar1,in_stack_fffffffffffffd90))));
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      Colour::~Colour((Colour *)0x182c89);
      goto LAB_001831f4;
    }
    if (OVar5 == Warning) {
      Colour::Colour((Colour *)in_stack_fffffffffffffd10,CVar9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"warning",&local_149);
      AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffd08);
      streamVariableLengthText
                (this_01,in_RDI,
                 (string *)
                 CONCAT17(uVar11,CONCAT16(bVar10,CONCAT15(uVar1,in_stack_fffffffffffffd90))));
      std::__cxx11::string::~string(local_170);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      Colour::~Colour((Colour *)0x182db0);
      goto LAB_001831f4;
    }
    if (1 < (uint)(OVar5 + 0xfffffff0)) {
      if (OVar5 == ExplicitFailure) {
        Colour::Colour((Colour *)in_stack_fffffffffffffd10,CVar9);
        poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
        poVar8 = std::operator<<(poVar8,"failed with message: \'");
        AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffd08);
        poVar8 = std::operator<<(poVar8,local_198);
        std::operator<<(poVar8,"\'");
        std::__cxx11::string::~string(local_198);
        Colour::~Colour((Colour *)0x182ec4);
        goto LAB_001831f4;
      }
      if (OVar5 != Exception) {
        if (OVar5 == ThrewException) {
          Colour::Colour((Colour *)in_stack_fffffffffffffd10,CVar9);
          bVar3 = AssertionResult::hasExpression((AssertionResult *)0x182a18);
          if (bVar3) {
            poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
            std::operator<<(poVar8," with unexpected");
          }
          else {
            poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
            std::operator<<(poVar8,"Unexpected");
          }
          poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
          poVar8 = std::operator<<(poVar8," exception with message: \'");
          AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffd08);
          poVar8 = std::operator<<(poVar8,local_d0);
          std::operator<<(poVar8,"\'");
          std::__cxx11::string::~string(local_d0);
          Colour::~Colour((Colour *)0x182b03);
        }
        else if (OVar5 == DidntThrowException) {
          Colour::Colour((Colour *)in_stack_fffffffffffffd10,CVar9);
          bVar3 = AssertionResult::hasExpression((AssertionResult *)0x182b5a);
          if (bVar3) {
            poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
            std::operator<<(poVar8," because no exception was thrown where one was expected");
          }
          else {
            poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
            std::operator<<(poVar8,"No exception thrown where one was expected");
          }
          Colour::~Colour((Colour *)0x182bdb);
        }
        goto LAB_001831f4;
      }
    }
  }
  bVar3 = AssertionResult::hasExpression((AssertionResult *)0x182f1f);
  if (!bVar3) {
    bVar3 = AssertionResult::succeeded((AssertionResult *)0x182f34);
    CVar9 = (Code)((ulong)in_stack_fffffffffffffd08 >> 0x20);
    if (bVar3) {
      Colour::Colour((Colour *)in_stack_fffffffffffffd10,CVar9);
      poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
      std::operator<<(poVar8," succeeded");
      Colour::~Colour((Colour *)0x182f7b);
    }
    else {
      Colour::Colour((Colour *)in_stack_fffffffffffffd10,CVar9);
      poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
      std::operator<<(poVar8," failed");
      bVar3 = AssertionResult::isOk(in_stack_fffffffffffffd10);
      if (bVar3) {
        Colour::Colour((Colour *)in_stack_fffffffffffffd10,
                       (Code)((ulong)in_stack_fffffffffffffd08 >> 0x20));
        poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
        std::operator<<(poVar8," - but was ok");
        Colour::~Colour((Colour *)0x18303a);
      }
      Colour::~Colour((Colour *)0x183082);
    }
  }
  bVar3 = AssertionResult::hasMessage((AssertionResult *)0x1830a5);
  if (bVar3) {
    poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
    std::operator<<(poVar8,"\n");
    Colour::Colour((Colour *)in_stack_fffffffffffffd10,
                   (Code)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c0,"with message",&local_1c1);
    AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffd08);
    streamVariableLengthText
              (this_01,in_RDI,
               (string *)CONCAT17(uVar11,CONCAT16(bVar10,CONCAT15(uVar1,in_stack_fffffffffffffd90)))
              );
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    Colour::~Colour((Colour *)0x183177);
  }
LAB_001831f4:
  bVar3 = AssertionResult::hasExpandedExpression(in_stack_fffffffffffffd68);
  if (bVar3) {
    poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
    std::operator<<(poVar8," for: ");
    AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_fffffffffffffd08);
    uVar7 = std::__cxx11::string::size();
    std::__cxx11::string::~string(local_208);
    if (0x28 < uVar7) {
      poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
      std::operator<<(poVar8,"\n");
      AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_fffffffffffffd08);
      in_stack_fffffffffffffd10 = (AssertionResult *)std::__cxx11::string::size();
      std::__cxx11::string::~string(local_228);
      if (in_stack_fffffffffffffd10 < (AssertionResult *)0x46) {
        poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
        std::operator<<(poVar8,"\t");
      }
    }
    Colour::Colour((Colour *)in_stack_fffffffffffffd10,
                   (Code)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    this_00 = (AssertionResult *)ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
    AssertionResult::getExpandedExpression_abi_cxx11_(this_00);
    std::operator<<((ostream *)this_00,local_250);
    std::__cxx11::string::~string(local_250);
    Colour::~Colour((Colour *)0x183359);
  }
  poVar8 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

virtual void Result( const AssertionResult& assertionResult ) {
            if( !m_config.fullConfig()->includeSuccessfulResults() && assertionResult.getResultType() == ResultWas::Ok )
                return;

            startSpansLazily();

            if( !assertionResult.getSourceInfo().empty() ) {
                Colour colour( Colour::FileName );
                m_config.stream() << assertionResult.getSourceInfo() << ": ";
            }

            if( assertionResult.hasExpression() ) {
                Colour colour( Colour::OriginalExpression );
                m_config.stream() << assertionResult.getExpression();
                if( assertionResult.succeeded() ) {
                    Colour successColour( Colour::Success );
                    m_config.stream() << " succeeded";
                }
                else {
                    Colour errorColour( Colour::Error );
                    m_config.stream() << " failed";
                    if( assertionResult.isOk() ) {
                        Colour okAnywayColour( Colour::Success );
                        m_config.stream() << " - but was ok";
                    }
                }
            }
            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    {
                        Colour colour( Colour::Error );
                        if( assertionResult.hasExpression() )
                            m_config.stream() << " with unexpected";
                        else
                            m_config.stream() << "Unexpected";
                        m_config.stream() << " exception with message: '" << assertionResult.getMessage() << "'";
                    }
                    break;
                case ResultWas::DidntThrowException:
                    {
                        Colour colour( Colour::Error );
                        if( assertionResult.hasExpression() )
                            m_config.stream() << " because no exception was thrown where one was expected";
                        else
                            m_config.stream() << "No exception thrown where one was expected";
                    }
                    break;
                case ResultWas::Info:
                    {
                        Colour colour( Colour::ReconstructedExpression );
                        streamVariableLengthText( "info", assertionResult.getMessage() );
                    }
                    break;
                case ResultWas::Warning:
                    {
                        Colour colour( Colour::ReconstructedExpression );
                        streamVariableLengthText( "warning", assertionResult.getMessage() );
                    }
                    break;
                case ResultWas::ExplicitFailure:
                    {
                        Colour colour( Colour::Error );
                        m_config.stream() << "failed with message: '" << assertionResult.getMessage() << "'";
                    }
                    break;
                case ResultWas::Unknown: // These cases are here to prevent compiler warnings
                case ResultWas::Ok:
                case ResultWas::FailureBit:
                case ResultWas::ExpressionFailed:
                case ResultWas::Exception:
                    if( !assertionResult.hasExpression() ) {
                        if( assertionResult.succeeded() ) {
                            Colour colour( Colour::Success );
                            m_config.stream() << " succeeded";
                        }
                        else {
                            Colour colour( Colour::Error );
                            m_config.stream() << " failed";
                            if( assertionResult.isOk() ) {
                                Colour okAnywayColour( Colour::Success );
                                m_config.stream() << " - but was ok";
                            }
                        }
                    }
                    if( assertionResult.hasMessage() ) {
                        m_config.stream() << "\n";
                        Colour colour( Colour::ReconstructedExpression );
                        streamVariableLengthText( "with message", assertionResult.getMessage() );
                    }
                    break;
            }

            if( assertionResult.hasExpandedExpression() ) {
                m_config.stream() << " for: ";
                if( assertionResult.getExpandedExpression().size() > 40 ) {
                    m_config.stream() << "\n";
                    if( assertionResult.getExpandedExpression().size() < 70 )
                        m_config.stream() << "\t";
                }
                Colour colour( Colour::ReconstructedExpression );
                m_config.stream() << assertionResult.getExpandedExpression();
            }
            m_config.stream() << std::endl;
        }